

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int maxDamageBinIdx;
  void *pvVar3;
  undefined7 uVar5;
  size_t sVar4;
  bool useIndexFile;
  bool zip;
  allocator local_211a;
  allocator local_2119;
  undefined4 local_2118;
  undefined4 local_2114;
  string local_2110;
  string local_20f0;
  sigaction sa;
  char idxFileName [4096];
  char binFileName [4096];
  
  progname = *argv;
  memcpy(binFileName,"vulnerability.bin",0x1000);
  pvVar3 = memcpy(idxFileName,"vulnerability.idx",0x1000);
  maxDamageBinIdx = -1;
  uVar5 = (undefined7)((ulong)pvVar3 >> 8);
  local_2114 = (undefined4)CONCAT71(uVar5,1);
  zip = false;
  local_2118 = (undefined4)CONCAT71(uVar5,1);
  bVar1 = false;
  while( true ) {
    while (iVar2 = getopt(argc,argv,"d:izNShv"), iVar2 == 100) {
      maxDamageBinIdx = atoi(_optarg);
    }
    if (iVar2 == -1) break;
    if (iVar2 == 0x4e) {
      local_2114 = 0;
    }
    else if (iVar2 == 0x53) {
      local_2118 = 0;
    }
    else if (iVar2 == 0x69) {
      bVar1 = true;
    }
    else {
      if (iVar2 != 0x7a) {
        if (iVar2 == 0x76) {
          fprintf(_stderr,"%s : version : %s\n",*argv,"");
        }
        else {
          Help();
        }
LAB_00103f79:
        exit(1);
      }
      sVar4 = strlen(binFileName);
      (binFileName + sVar4)[0] = '.';
      (binFileName + sVar4)[1] = 'z';
      binFileName[sVar4 + 2] = '\0';
      sVar4 = strlen(idxFileName);
      (idxFileName + sVar4)[0] = '.';
      (idxFileName + sVar4)[1] = 'z';
      idxFileName[sVar4 + 2] = '\0';
      zip = true;
    }
  }
  if (maxDamageBinIdx != -1) {
    useIndexFile = bVar1;
    if ((zip) && (useIndexFile = true, bVar1)) {
      fwrite("INFO: Index files are always created when zip output is requested.\n",0x43,1,_stderr);
    }
    memset(&sa,0,0x98);
    sigemptyset((sigset_t *)&sa.sa_mask);
    sa.__sigaction_handler.sa_handler = SegFaultSigAction;
    sa.sa_flags = 4;
    sigaction(0xb,(sigaction *)&sa,(sigaction *)0x0);
    std::__cxx11::string::string((string *)&local_20f0,"",&local_2119);
    std::__cxx11::string::string((string *)&local_2110,"",&local_211a);
    initstreams(&local_20f0,&local_2110);
    std::__cxx11::string::~string((string *)&local_2110);
    std::__cxx11::string::~string((string *)&local_20f0);
    DoIt(maxDamageBinIdx,binFileName,idxFileName,useIndexFile,zip,(bool)((byte)local_2114 & 1),
         (bool)((byte)local_2118 & 1));
    return 0;
  }
  fwrite("ERROR: Damage bin parameter not supplied.\n",0x2a,1,_stderr);
  goto LAB_00103f79;
}

Assistant:

int main(int argc, char *argv[]) {

  progname = argv[0];
  int maxDamageBinIdx = -1;
  char binFileName[4096] = "vulnerability.bin";
  char idxFileName[4096] = "vulnerability.idx";
  bool useIndexFile = false;
  bool zip = false;
  bool validationCheck = true;
  bool allIntensityBinsCheck = true;
  int opt;
  while ((opt = getopt(argc, argv, "d:izNShv")) != -1) {
    switch (opt) {
      case 'd':
        maxDamageBinIdx = atoi(optarg);
	break;
      case 'i':
	useIndexFile = true;
	break;
      case 'z':
	zip = true;
        strcat(binFileName, ".z");
	strcat(idxFileName, ".z");
	break;
      case 'N':
	validationCheck = false;
	break;
      case 'S':
	allIntensityBinsCheck = false;
	break;
      case 'v':
	fprintf(stderr, "%s : version : %s\n", argv[0], VERSION);
        exit(EXIT_FAILURE);
      case 'h':
      default:
	Help();
	exit(EXIT_FAILURE);
    }
  }

  if (maxDamageBinIdx == -1) {
    fprintf(stderr, "ERROR: Damage bin parameter not supplied.\n");
    exit(EXIT_FAILURE);
  }

  // There is no need for user to give command line argument for index file
  // creation when zip output is requested.
  if (zip) {
    if (useIndexFile) {
      fprintf(stderr, "INFO: Index files are always created when zip output is"
		      " requested.\n");
    }
    useIndexFile = zip;   // Ensure downstream conditionals work
  }

#if !defined(_MSC_VER) && !defined(__MINGW32__)
  struct sigaction sa;

  memset(&sa, 0, sizeof(struct sigaction));
  sigemptyset(&sa.sa_mask);
  sa.sa_sigaction = SegFaultSigAction;
  sa.sa_flags = SA_SIGINFO;

  sigaction(SIGSEGV, &sa, NULL);
#endif

  try {

    initstreams();
    DoIt(maxDamageBinIdx, binFileName, idxFileName, useIndexFile, zip,
	 validationCheck, allIntensityBinsCheck);
    return 0;

  } catch (std::bad_alloc&) {

    fprintf(stderr, "ERROR: %s: Memory allocation failed.\n", progname);
    exit(EXIT_FAILURE);

  }

}